

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

int Abc_TtMinBase(word *pTruth,int *pVars,int nVars,int nVarsAll)

{
  word *pwVar1;
  ulong uVar2;
  word wVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  word *pwVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  word *pwVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  word *pwVar21;
  word *pwVar22;
  ulong uVar23;
  ulong uVar24;
  word *pwVar25;
  word *pLimit;
  
  if (nVarsAll < nVars) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  if (nVars < 1) {
    uVar4 = 0;
  }
  else {
    iVar11 = nVarsAll + -6;
    uVar18 = 1 << ((byte)iVar11 & 0x1f);
    pwVar1 = pTruth + (int)uVar18;
    if ((int)uVar18 < 2) {
      uVar18 = 1;
    }
    uVar23 = 0;
    uVar4 = 0;
    do {
      if (uVar23 == (uint)nVarsAll) {
        __assert_fail("iVar < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x582,"int Abc_TtHasVar(word *, int, int)");
      }
      uVar5 = (uint)uVar23;
      if (nVarsAll < 7) {
        if ((s_Truths6Neg[uVar23] &
            (*pTruth >> ((byte)(1 << ((byte)uVar23 & 0x1f)) & 0x3f) ^ *pTruth)) != 0) {
LAB_0077331e:
          if ((long)(int)uVar4 < (long)uVar23) {
            if (pVars != (int *)0x0) {
              pVars[(int)uVar4] = pVars[uVar23];
            }
            if (uVar23 != uVar4) {
              uVar13 = uVar4;
              if ((int)uVar4 < (int)uVar5) {
                uVar13 = uVar5;
              }
              uVar15 = uVar4;
              if ((int)uVar5 < (int)uVar4) {
                uVar15 = uVar5;
              }
              if (((int)uVar13 <= (int)uVar15) || (nVarsAll <= (int)uVar13)) {
                __assert_fail("iVar < jVar && jVar < nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                              ,0x692,"void Abc_TtSwapVars(word *, int, int, int)");
              }
              bVar9 = (byte)uVar15;
              if (nVarsAll < 7) {
                uVar14 = *pTruth;
                bVar9 = (char)(-1 << (bVar9 & 0x1f)) + (char)(1 << ((byte)uVar13 & 0x1f));
                uVar24 = (ulong)uVar13;
                lVar20 = (long)(int)uVar15 * 0x90;
                *pTruth = (uVar14 & *(ulong *)(lVar20 + 0xa2ef70 + uVar24 * 0x18)) >> (bVar9 & 0x3f)
                          | (*(ulong *)(lVar20 + 0xa2ef68 + uVar24 * 0x18) & uVar14) <<
                            (bVar9 & 0x3f) | s_PPMasks[(int)uVar15][uVar24][0] & uVar14;
              }
              else if (uVar13 < 6) {
                if (iVar11 != 0x1f) {
                  bVar9 = (char)(1 << ((byte)uVar13 & 0x1f)) + (char)(-1 << (bVar9 & 0x1f));
                  uVar6 = (ulong)uVar13;
                  lVar20 = (long)(int)uVar15 * 0x90;
                  uVar14 = s_PPMasks[(int)uVar15][uVar6][0];
                  uVar24 = *(ulong *)(lVar20 + 0xa2ef68 + uVar6 * 0x18);
                  uVar6 = *(ulong *)(lVar20 + 0xa2ef70 + uVar6 * 0x18);
                  uVar16 = 0;
                  do {
                    uVar2 = pTruth[uVar16];
                    pTruth[uVar16] =
                         (uVar2 & uVar6) >> (bVar9 & 0x3f) |
                         (uVar2 & uVar24) << (bVar9 & 0x3f) | uVar2 & uVar14;
                    uVar16 = uVar16 + 1;
                  } while (uVar18 != uVar16);
                }
              }
              else if ((int)uVar15 < 6) {
                if (iVar11 != 0x1f) {
                  bVar10 = (byte)(uVar13 - 6);
                  uVar5 = 1 << (bVar10 & 0x1f);
                  iVar19 = 2 << (bVar10 & 0x1f);
                  uVar14 = 1;
                  if (1 < (int)uVar5) {
                    uVar14 = (ulong)uVar5;
                  }
                  pwVar7 = pTruth + (int)uVar5;
                  pwVar12 = pTruth;
                  do {
                    if (uVar13 - 6 != 0x1f) {
                      uVar24 = s_Truths6[(int)uVar15];
                      uVar6 = 0;
                      do {
                        uVar16 = pwVar12[uVar6];
                        bVar10 = (byte)(1 << (bVar9 & 0x1f));
                        uVar2 = pwVar7[uVar6];
                        pwVar12[uVar6] = uVar16 & ~uVar24 | uVar2 << (bVar10 & 0x3f) & uVar24;
                        pwVar7[uVar6] = uVar2 & uVar24 | (uVar16 & uVar24) >> (bVar10 & 0x3f);
                        uVar6 = uVar6 + 1;
                      } while (uVar14 != uVar6);
                    }
                    pwVar12 = pwVar12 + iVar19;
                    pwVar7 = pwVar7 + iVar19;
                  } while (pwVar12 < pwVar1);
                }
              }
              else if (iVar11 != 0x1f) {
                bVar9 = (byte)(uVar13 - 6);
                bVar10 = (byte)(uVar15 - 6);
                uVar5 = 1 << (bVar10 & 0x1f);
                iVar19 = 2 << (bVar9 & 0x1f);
                uVar14 = 1;
                if (1 < (int)uVar5) {
                  uVar14 = (ulong)uVar5;
                }
                lVar17 = (long)(2 << (bVar10 & 0x1f));
                lVar20 = (long)(1 << (bVar9 & 0x1f));
                pwVar7 = pTruth + lVar20;
                pwVar12 = pTruth + (int)uVar5;
                pwVar25 = pTruth;
                do {
                  if (uVar13 - 6 != 0x1f) {
                    lVar8 = 0;
                    pwVar21 = pwVar7;
                    pwVar22 = pwVar12;
                    do {
                      if (uVar15 - 6 != 0x1f) {
                        uVar24 = 0;
                        do {
                          wVar3 = pwVar22[uVar24];
                          pwVar22[uVar24] = pwVar21[uVar24];
                          pwVar21[uVar24] = wVar3;
                          uVar24 = uVar24 + 1;
                        } while (uVar14 != uVar24);
                      }
                      lVar8 = lVar8 + lVar17;
                      pwVar21 = pwVar21 + lVar17;
                      pwVar22 = pwVar22 + lVar17;
                    } while (lVar8 < lVar20);
                  }
                  pwVar25 = pwVar25 + iVar19;
                  pwVar7 = pwVar7 + iVar19;
                  pwVar12 = pwVar12 + iVar19;
                } while (pwVar25 < pwVar1);
              }
            }
          }
          uVar4 = uVar4 + 1;
        }
      }
      else if (uVar23 < 6) {
        if (iVar11 != 0x1f) {
          uVar14 = 0;
          do {
            if (((pTruth[uVar14] >> ((byte)(1 << ((byte)uVar23 & 0x1f)) & 0x3f) ^ pTruth[uVar14]) &
                s_Truths6Neg[uVar23]) != 0) goto LAB_0077331e;
            uVar14 = uVar14 + 1;
          } while (uVar18 != uVar14);
        }
      }
      else if (iVar11 != 0x1f) {
        bVar9 = (byte)(uVar23 - 6);
        uVar13 = 1 << (bVar9 & 0x1f);
        iVar19 = 2 << (bVar9 & 0x1f);
        uVar14 = 1;
        if (1 < (int)uVar13) {
          uVar14 = (ulong)uVar13;
        }
        pwVar7 = pTruth + (int)uVar13;
        pwVar12 = pTruth;
        do {
          if (uVar23 - 6 != 0x1f) {
            uVar24 = 0;
            do {
              if (pwVar12[uVar24] != pwVar7[uVar24]) goto LAB_0077331e;
              uVar24 = uVar24 + 1;
            } while (uVar14 != uVar24);
          }
          pwVar12 = pwVar12 + iVar19;
          pwVar7 = pwVar7 + iVar19;
        } while (pwVar12 < pwVar1);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != (uint)nVars);
  }
  if (nVars < (int)uVar4) {
    __assert_fail("k < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  return uVar4;
}

Assistant:

static inline int Abc_TtMinBase( word * pTruth, int * pVars, int nVars, int nVarsAll ) 
{
    int i, k;
    assert( nVars <= nVarsAll );
    for ( i = k = 0; i < nVars; i++ )
    {
        if ( !Abc_TtHasVar( pTruth, nVarsAll, i ) )
            continue;
        if ( k < i )
        {
            if ( pVars ) pVars[k] = pVars[i];
            Abc_TtSwapVars( pTruth, nVarsAll, k, i );
        }
        k++;
    }
    if ( k == nVars )
        return k;
    assert( k < nVars );
//    assert( k == Abc_TtSupportSize(pTruth, nVars) );
    return k;
}